

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::SimpleDescriptorDatabase::~SimpleDescriptorDatabase
          (SimpleDescriptorDatabase *this)

{
  SimpleDescriptorDatabase *this_local;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__SimpleDescriptorDatabase_006fa898;
  STLDeleteElements<std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>
            (&this->files_to_delete_);
  std::
  vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
  ::~vector(&this->files_to_delete_);
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::~DescriptorIndex(&this->index_);
  DescriptorDatabase::~DescriptorDatabase(&this->super_DescriptorDatabase);
  return;
}

Assistant:

SimpleDescriptorDatabase::~SimpleDescriptorDatabase() {
  STLDeleteElements(&files_to_delete_);
}